

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::DebugNodeTable(ImGuiTable *table)

{
  ImSpan<ImGuiTableColumn> *this;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  bool bVar9;
  _Bool _Var10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  ImVec4 *col;
  ImDrawList *pIVar14;
  ImGuiTableColumn *pIVar15;
  ImGuiTableSettings *settings;
  char *pcVar16;
  byte bVar17;
  char *pcVar18;
  int n;
  int iVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  double dVar23;
  float local_28c;
  ImRect r;
  ImVec2 local_240;
  char buf [512];
  
  iVar19 = table->LastFrameActive;
  iVar11 = GetFrameCount();
  iVar11 = iVar11 + -2;
  pcVar13 = " *Inactive*";
  if (iVar11 <= iVar19) {
    pcVar13 = "";
  }
  ImFormatString(buf,0x200,"Table 0x%08X (%d columns, in \'%s\')%s",(ulong)table->ID,
                 (ulong)(uint)table->ColumnsCount,table->OuterWindow->Name,pcVar13);
  if (iVar19 < iVar11) {
    col = GetStyleColorVec4(1);
    PushStyleColor(0,col);
  }
  bVar9 = TreeNode(table,"%s",buf);
  if (iVar19 < iVar11) {
    PopStyleColor(1);
  }
  _Var10 = IsItemHovered(0);
  if (_Var10) {
    pIVar14 = GetForegroundDrawList();
    ImDrawList::AddRect(pIVar14,&(table->OuterRect).Min,&(table->OuterRect).Max,0xff00ffff,0.0,0,1.0
                       );
  }
  _Var10 = IsItemVisible();
  if ((_Var10) && (table->HoveredColumnBody != -1)) {
    pIVar14 = GetForegroundDrawList();
    r.Min = GetItemRectMin();
    local_240 = GetItemRectMax();
    ImDrawList::AddRect(pIVar14,&r.Min,&local_240,0xff00ffff,0.0,0,1.0);
  }
  if (bVar9) {
    bVar9 = SmallButton("Clear settings");
    fVar1 = (table->OuterRect).Min.x;
    fVar2 = (table->OuterRect).Min.y;
    uVar12 = (table->Flags & 0xe000U) - 0x2000;
    if (uVar12 < 0x8000) {
      pcVar13 = &DAT_00277a24 + *(int *)(&DAT_00277a24 + (uVar12 >> 0xb));
    }
    else {
      pcVar13 = "N/A";
    }
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: \'%s\'",(double)fVar1,
               (double)fVar2,(double)((table->OuterRect).Max.x - fVar1),
               (double)((table->OuterRect).Max.y - fVar2),pcVar13);
    fVar1 = table->InnerWidth;
    local_28c = 0.0;
    pcVar13 = " (auto)";
    if (fVar1 != 0.0) {
      pcVar13 = "";
    }
    if (NAN(fVar1)) {
      pcVar13 = "";
    }
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s",
               (double)table->ColumnsGivenWidth,(double)table->ColumnsAutoFitWidth,(double)fVar1,
               pcVar13);
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f",
               (double)table->CellPaddingX,(double)table->CellSpacingX1,(double)table->CellSpacingX2
               ,(double)table->OuterPaddingX);
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d",
               (ulong)(uint)(int)table->HoveredColumnBody,
               (ulong)(uint)(int)table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d",
               (ulong)(uint)(int)table->ResizedColumn,(ulong)(uint)(int)table->ReorderColumn,
               (ulong)(uint)(int)table->HeldHeaderColumn);
    this = &table->Columns;
    for (iVar19 = 0; iVar11 = table->ColumnsCount, iVar19 < iVar11; iVar19 = iVar19 + 1) {
      pIVar15 = ImSpan<ImGuiTableColumn>::operator[](this,iVar19);
      if ((pIVar15->Flags & 8) != 0) {
        pIVar15 = ImSpan<ImGuiTableColumn>::operator[](this,iVar19);
        local_28c = local_28c + pIVar15->StretchWeight;
      }
    }
    for (uVar12 = 0; (int)uVar12 < iVar11; uVar12 = uVar12 + 1) {
      pIVar15 = ImSpan<ImGuiTableColumn>::operator[](this,uVar12);
      pcVar13 = TableGetColumnName(table,uVar12);
      fVar1 = pIVar15->MinX;
      fVar2 = (table->WorkRect).Min.x;
      fVar3 = pIVar15->MaxX;
      pcVar20 = "";
      if ((int)uVar12 < (int)table->FreezeColumnsRequest) {
        pcVar20 = " (Frozen)";
      }
      fVar4 = pIVar15->StretchWeight;
      if (0.0 < fVar4) {
        dVar23 = (double)((fVar4 / local_28c) * 100.0);
      }
      else {
        dVar23 = 0.0;
      }
      fVar5 = (pIVar15->ClipRect).Min.x;
      fVar6 = (pIVar15->ClipRect).Max.x;
      fVar7 = pIVar15->WorkMinX;
      bVar17 = pIVar15->field_0x65 & 3;
      pcVar21 = "";
      if (bVar17 == 2) {
        pcVar21 = " (Des)";
      }
      if (bVar17 == 1) {
        pcVar21 = " (Asc)";
      }
      uVar8 = pIVar15->Flags;
      pcVar18 = "WidthStretch ";
      if ((uVar8 & 8) == 0) {
        pcVar18 = "";
      }
      pcVar22 = "WidthFixed ";
      if ((uVar8 & 0x10) == 0) {
        pcVar22 = "";
      }
      pcVar16 = "NoResize ";
      if ((uVar8 & 0x20) == 0) {
        pcVar16 = "";
      }
      ImFormatString(buf,0x200,
                     "Column %d order %d \'%s\': offset %+.2f to %+.2f%s\nEnabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\nWidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\nMinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\nContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\nSort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s.."
                     ,(double)(fVar1 - fVar2),(double)(fVar3 - fVar2),(double)pIVar15->WidthGiven,
                     (double)pIVar15->WidthRequest,(double)pIVar15->WidthAuto,(double)fVar4,dVar23,
                     (double)fVar1,(ulong)uVar12,(ulong)(uint)(int)pIVar15->DisplayOrder,pcVar13,
                     pcVar20,(uint)pIVar15->IsEnabled,(uint)pIVar15->IsVisibleX,
                     (uint)pIVar15->IsVisibleY,(uint)pIVar15->IsRequestOutput,
                     (uint)pIVar15->IsSkipItems,(uint)pIVar15->DrawChannelFrozen,
                     (uint)pIVar15->DrawChannelUnfrozen,(double)fVar3,(double)(fVar3 - fVar1),
                     (double)fVar5,(double)fVar6,(double)(fVar6 - fVar5),
                     (double)(pIVar15->ContentMaxXFrozen - fVar7),
                     (double)(pIVar15->ContentMaxXUnfrozen - fVar7),
                     (double)(pIVar15->ContentMaxXHeadersUsed - fVar7),
                     (double)(pIVar15->ContentMaxXHeadersIdeal - fVar7),(int)pIVar15->SortOrder,
                     pcVar21,pIVar15->UserID,uVar8,pcVar18,pcVar22,pcVar16);
      Bullet();
      r.Min.x = 0.0;
      r.Min.y = 0.0;
      Selectable(buf,false,0,&r.Min);
      _Var10 = IsItemHovered(0);
      if (_Var10) {
        r.Max.x = pIVar15->MaxX;
        r.Max.y = (table->OuterRect).Max.y;
        r.Min.y = (table->OuterRect).Min.y;
        r.Min.x = pIVar15->MinX;
        pIVar14 = GetForegroundDrawList();
        ImDrawList::AddRect(pIVar14,&r.Min,&r.Max,0xff00ffff,0.0,0,1.0);
      }
      iVar11 = table->ColumnsCount;
    }
    settings = TableGetBoundSettings(table);
    if (settings != (ImGuiTableSettings *)0x0) {
      DebugNodeTableSettings(settings);
    }
    if (bVar9) {
      table->IsResetAllRequest = true;
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTable(ImGuiTable* table)
{
    char buf[512];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (table->LastFrameActive >= ImGui::GetFrameCount() - 2); // Note that fully clipped early out scrolling tables will appear as inactive here.
    ImFormatString(p, buf_end - p, "Table 0x%08X (%d columns, in '%s')%s", table->ID, table->ColumnsCount, table->OuterWindow->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(table, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered())
        GetForegroundDrawList()->AddRect(table->OuterRect.Min, table->OuterRect.Max, IM_COL32(255, 255, 0, 255));
    if (IsItemVisible() && table->HoveredColumnBody != -1)
        GetForegroundDrawList()->AddRect(GetItemRectMin(), GetItemRectMax(), IM_COL32(255, 255, 0, 255));
    if (!open)
        return;
    bool clear_settings = SmallButton("Clear settings");
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: '%s'", table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.GetWidth(), table->OuterRect.GetHeight(), DebugNodeTableGetSizingPolicyDesc(table->Flags));
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s", table->ColumnsGivenWidth, table->ColumnsAutoFitWidth, table->InnerWidth, table->InnerWidth == 0.0f ? " (auto)" : "");
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f", table->CellPaddingX, table->CellSpacingX1, table->CellSpacingX2, table->OuterPaddingX);
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d", table->HoveredColumnBody, table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d", table->ResizedColumn, table->ReorderColumn, table->HeldHeaderColumn);
    //BulletText("BgDrawChannels: %d/%d", 0, table->BgDrawChannelUnfrozen);
    float sum_weights = 0.0f;
    for (int n = 0; n < table->ColumnsCount; n++)
        if (table->Columns[n].Flags & ImGuiTableColumnFlags_WidthStretch)
            sum_weights += table->Columns[n].StretchWeight;
    for (int n = 0; n < table->ColumnsCount; n++)
    {
        ImGuiTableColumn* column = &table->Columns[n];
        const char* name = TableGetColumnName(table, n);
        ImFormatString(buf, IM_ARRAYSIZE(buf),
            "Column %d order %d '%s': offset %+.2f to %+.2f%s\n"
            "Enabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\n"
            "WidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\n"
            "MinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\n"
            "ContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\n"
            "Sort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s..",
            n, column->DisplayOrder, name, column->MinX - table->WorkRect.Min.x, column->MaxX - table->WorkRect.Min.x, (n < table->FreezeColumnsRequest) ? " (Frozen)" : "",
            column->IsEnabled, column->IsVisibleX, column->IsVisibleY, column->IsRequestOutput, column->IsSkipItems, column->DrawChannelFrozen, column->DrawChannelUnfrozen,
            column->WidthGiven, column->WidthRequest, column->WidthAuto, column->StretchWeight, column->StretchWeight > 0.0f ? (column->StretchWeight / sum_weights) * 100.0f : 0.0f,
            column->MinX, column->MaxX, column->MaxX - column->MinX, column->ClipRect.Min.x, column->ClipRect.Max.x, column->ClipRect.Max.x - column->ClipRect.Min.x,
            column->ContentMaxXFrozen - column->WorkMinX, column->ContentMaxXUnfrozen - column->WorkMinX, column->ContentMaxXHeadersUsed - column->WorkMinX, column->ContentMaxXHeadersIdeal - column->WorkMinX,
            column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? " (Asc)" : (column->SortDirection == ImGuiSortDirection_Descending) ? " (Des)" : "", column->UserID, column->Flags,
            (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? "WidthStretch " : "",
            (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? "WidthFixed " : "",
            (column->Flags & ImGuiTableColumnFlags_NoResize) ? "NoResize " : "");
        Bullet();
        Selectable(buf);
        if (IsItemHovered())
        {
            ImRect r(column->MinX, table->OuterRect.Min.y, column->MaxX, table->OuterRect.Max.y);
            GetForegroundDrawList()->AddRect(r.Min, r.Max, IM_COL32(255, 255, 0, 255));
        }
    }
    if (ImGuiTableSettings* settings = TableGetBoundSettings(table))
        DebugNodeTableSettings(settings);
    if (clear_settings)
        table->IsResetAllRequest = true;
    TreePop();
}